

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

Value * __thiscall
soul::AST::TypeMetaFunction::getResultValue(Value *__return_storage_ptr__,TypeMetaFunction *this)

{
  Op op;
  bool bVar1;
  uint uVar2;
  byte local_3d;
  Type local_30;
  TypeMetaFunction *local_18;
  TypeMetaFunction *this_local;
  
  local_18 = this;
  this_local = (TypeMetaFunction *)__return_storage_ptr__;
  uVar2 = (*(this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])();
  local_3d = 0;
  if ((uVar2 & 1) != 0) {
    bVar1 = operationReturnsAType(this->operation);
    local_3d = bVar1 ^ 0xff;
  }
  checkAssertion((bool)(local_3d & 1),"isResolved() && ! operationReturnsAType (operation)",
                 "getResultValue",0x7e6);
  op = this->operation;
  getSourceType(&local_30,this);
  performOp(__return_storage_ptr__,op,&local_30);
  Type::~Type(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Value getResultValue() const
        {
            SOUL_ASSERT (isResolved() && ! operationReturnsAType (operation));
            return performOp (operation, getSourceType());
        }